

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
dynet::Reshape::forward_impl
          (Reshape *this,vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,
          Tensor *fx)

{
  Device_CPU *in_RDX;
  Reshape *in_RSI;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDI;
  Tensor *in_stack_ffffffffffffffd8;
  
  if (*(long *)((long)&(in_RDX->super_Device).name.field_2 + 8) == 0) {
    __assert_fail("fx.device",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0x613,
                  "virtual void dynet::Reshape::forward_impl(const std::vector<const Tensor *> &, Tensor &) const"
                 );
  }
  if (*(int *)(*(long *)((long)&(in_RDX->super_Device).name.field_2 + 8) + 0xc) == 0) {
    forward_dev_impl<dynet::Device_CPU>(in_RSI,in_RDX,in_RDI,in_stack_ffffffffffffffd8);
    return;
  }
  abort();
}

Assistant:

void RestrictedLogSoftmax::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef __CUDACC__
  throw std::runtime_error("RestrictedLogSoftmax not yet implemented for CUDA");
#else
  // TODO create auxiliary mask with -infty's
  // and do usual LogSoftmax stuff
  assert(xs.size() == 1);
  assert(denom.size() > 0);
  auto x = **xs[0];
  assert(x.cols() == 1);
  const real logz = logsumexp(x, denom);
  TensorTools::Constant(fx, -numeric_limits<real>::infinity());
  for (auto i : denom)
    (*fx)(i,0) = x(i,0) - logz;
  if (denom.size() == 1) (*fx)(denom.front(), 0) = 0;
#endif
}